

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool CheckDataDirOption(ArgsManager *args)

{
  bool bVar1;
  long in_FS_OFFSET;
  path datadir;
  path *in_stack_ffffffffffffff18;
  byte local_d9;
  path *__p;
  path *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  allocator<char> in_stack_ffffffffffffff5f;
  string *in_stack_ffffffffffffff60;
  ArgsManager *in_stack_ffffffffffffff68;
  path local_78 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  local_78[0]._M_pathname.field_2._M_allocated_capacity = 0;
  local_78[0]._M_pathname.field_2._8_8_ = 0;
  local_78[0]._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_78[0]._M_pathname._M_string_length = 0;
  local_78[0]._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  __p = local_78;
  fs::path::path((path *)in_stack_ffffffffffffff18);
  ArgsManager::GetPathArg
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (path *)CONCAT17(in_stack_ffffffffffffff5f,
                              CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(&in_stack_ffffffffffffff18->_M_pathname);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  bVar1 = std::filesystem::__cxx11::path::empty(in_stack_ffffffffffffff18);
  local_d9 = 1;
  if (!bVar1) {
    fs::absolute(in_stack_ffffffffffffff48);
    local_d9 = std::filesystem::is_directory(__p);
    fs::path::~path((path *)in_stack_ffffffffffffff18);
  }
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_d9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CheckDataDirOption(const ArgsManager& args)
{
    const fs::path datadir{args.GetPathArg("-datadir")};
    return datadir.empty() || fs::is_directory(fs::absolute(datadir));
}